

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageBase.cpp
# Opt level: O3

void __thiscall MessageBase::info(MessageBase *this,string *message)

{
  spdlog::logger::log((this->logger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,0.0);
  return;
}

Assistant:

void MessageBase::info(const std::string& message) { logger->info(message); }